

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void Js::FunctionBody::GetShortNameFromUrl(LPCWSTR pchUrl,LPWSTR pchShortName,size_t cchBuffer)

{
  short sVar1;
  char16_t *pcVar2;
  size_t sVar3;
  char16_t *pcVar4;
  ulong uVar5;
  long lVar6;
  
  pcVar2 = PAL_wcsrchr(pchUrl,L'/');
  if (pcVar2 == (char16_t *)0x0) {
    pcVar2 = PAL_wcsrchr(pchUrl,L'\\');
  }
  if (pchShortName != (LPWSTR)0x0 && cchBuffer != 0) {
    pcVar4 = pcVar2 + 1;
    if (pcVar2 == (char16_t *)0x0) {
      pcVar4 = pchUrl;
    }
    if (pcVar4 != (char16_t *)0x0) {
      lVar6 = 0;
      sVar3 = cchBuffer;
      do {
        sVar1 = *(short *)((long)pcVar4 + lVar6);
        *(short *)((long)pchShortName + lVar6) = sVar1;
        if (sVar1 == 0) goto LAB_0077c6c1;
        lVar6 = lVar6 + 2;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
      sVar3 = 0;
LAB_0077c6c1:
      if (sVar3 != 0) {
        uVar5 = (cchBuffer - sVar3) + 1;
        if (uVar5 <= cchBuffer && cchBuffer - uVar5 != 0) {
          memset(pchShortName + uVar5,0xfd,(cchBuffer - uVar5) * 2);
          return;
        }
        return;
      }
    }
    *pchShortName = L'\0';
    if (1 < cchBuffer) {
      memset(pchShortName + 1,0xfd,cchBuffer * 2 - 2);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return;
}

Assistant:

void FunctionBody::GetShortNameFromUrl(__in LPCWSTR pchUrl, _Out_writes_z_(cchBuffer) LPWSTR pchShortName, __in size_t cchBuffer)
    {
        LPCWSTR pchFile = wcsrchr(pchUrl, _u('/'));
        if (pchFile == nullptr)
        {
            pchFile = wcsrchr(pchUrl, _u('\\'));
        }

        LPCWSTR pchToCopy = pchUrl;

        if (pchFile != nullptr)
        {
            pchToCopy = pchFile + 1;
        }

        wcscpy_s(pchShortName, cchBuffer, pchToCopy);
    }